

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::v5::file::dup(file *this,int __fd)

{
  int fd;
  basic_string_view<char> *this_00;
  int *unaff_retaddr;
  int in_stack_0000000c;
  system_error *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  int new_fd;
  char *in_stack_ffffffffffffffa8;
  
  fd = ::dup(__fd);
  if (fd == -1) {
    this_00 = (basic_string_view<char> *)__cxa_allocate_exception(0x18);
    __errno_location();
    basic_string_view<char>::basic_string_view(this_00,in_stack_ffffffffffffffa8);
    system_error::system_error<int>
              (in_stack_00000010,in_stack_0000000c,(string_view)in_stack_00000018,unaff_retaddr);
    __cxa_throw(this_00,&system_error::typeinfo,system_error::~system_error);
  }
  file(this,fd);
  return (int)this;
}

Assistant:

file file::dup(int fd) {
  // Don't retry as dup doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009695399/functions/dup.html
  int new_fd = FMT_POSIX_CALL(dup(fd));
  if (new_fd == -1)
    FMT_THROW(system_error(errno, "cannot duplicate file descriptor {}", fd));
  return file(new_fd);
}